

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Test * testing::internal::
       HandleSehExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                 (TestFactoryBase *object,offset_in_TestFactoryBase_to_subr method,char *location)

{
  Test *pTVar1;
  long in_RDX;
  code *in_RSI;
  long in_RDI;
  code *local_48;
  
  local_48 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_48 = *(code **)(in_RSI + *(long *)(in_RDI + in_RDX) + -1);
  }
  pTVar1 = (Test *)(*local_48)((long *)(in_RDI + in_RDX));
  return pTVar1;
}

Assistant:

Result HandleSehExceptionsInMethodIfSupported(T* object, Result (T::*method)(),
                                              const char* location) {
#if GTEST_HAS_SEH
  __try {
    return (object->*method)();
  } __except (internal::UnitTestOptions::GTestProcessSEH(  // NOLINT
      GetExceptionCode(), location)) {
    return static_cast<Result>(0);
  }
#else
  (void)location;
  return (object->*method)();
#endif  // GTEST_HAS_SEH
}